

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Unsubtyping::analyzePublicTypes(Unsubtyping *this,Module *wasm)

{
  undefined8 sub;
  bool bVar1;
  reference pHVar2;
  HeapType *pHVar3;
  optional<wasm::HeapType> oVar4;
  _Storage<wasm::HeapType,_true> local_60;
  optional<wasm::HeapType> super;
  HeapType type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  Module *wasm_local;
  Unsubtyping *this_local;
  
  wasm::ModuleUtils::getPublicHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2,wasm);
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                     ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2);
  type.id = (uintptr_t)
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&type), bVar1) {
    pHVar2 = __gnu_cxx::
             __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._8_8_ = pHVar2->id;
    oVar4 = HeapType::getDeclaredSuperType
                      ((HeapType *)
                       &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_engaged);
    local_60 = oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
    super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
         oVar4.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_60._M_value);
    sub = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_;
    if (bVar1) {
      pHVar3 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)&local_60._M_value);
      noteSubtype(this,(HeapType)sub,(HeapType)pHVar3->id);
    }
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  }
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__begin2);
  return;
}

Assistant:

void analyzePublicTypes(Module& wasm) {
    // We cannot change supertypes for anything public.
    for (auto type : ModuleUtils::getPublicHeapTypes(wasm)) {
      if (auto super = type.getDeclaredSuperType()) {
        noteSubtype(type, *super);
      }
    }
  }